

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_collision_bench.cc
# Opt level: O0

int main(void)

{
  int iVar1;
  time_t tVar2;
  size_t extraout_RDX;
  StringPiece command;
  pair<unsigned_long,_int> pVar3;
  pair<unsigned_long,_int> *local_78;
  int local_70;
  uint local_6c;
  int i_1;
  int collision_count;
  StringPiece local_58;
  uint64_t local_48;
  pair<unsigned_long,_int> local_40;
  int local_30 [2];
  int i;
  pair<unsigned_long,_int> *local_20;
  pair<unsigned_long,_int> *hashes;
  char **commands;
  int N;
  
  commands._4_4_ = 0;
  commands._0_4_ = 20000000;
  hashes = (pair<unsigned_long,_int> *)operator_new__(160000000);
  local_20 = (pair<unsigned_long,_int> *)operator_new__(320000000);
  local_78 = local_20;
  do {
    std::pair<unsigned_long,_int>::pair<unsigned_long,_int,_true>(local_78);
    local_78 = local_78 + 1;
  } while (local_78 != local_20 + 20000000);
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  for (local_30[0] = 0; local_30[0] < 20000000; local_30[0] = local_30[0] + 1) {
    RandomCommand((char **)(&hashes->first + local_30[0]));
    StringPiece::StringPiece(&local_58,(char *)(&hashes->first)[local_30[0]]);
    command.len_ = extraout_RDX;
    command.str_ = (char *)local_58.len_;
    local_48 = BuildLog::LogEntry::HashCommand((LogEntry *)local_58.str_,command);
    pVar3 = std::make_pair<unsigned_long,int&>(&local_48,local_30);
    local_40.first = pVar3.first;
    local_40.second = pVar3.second;
    std::pair<unsigned_long,_int>::operator=(local_20 + local_30[0],&local_40);
  }
  std::sort<std::pair<unsigned_long,int>*>(local_20,local_20 + 20000000);
  local_6c = 0;
  for (local_70 = 1; local_70 < 20000000; local_70 = local_70 + 1) {
    if ((local_20[local_70 + -1].first == local_20[local_70].first) &&
       (iVar1 = strcmp((char *)(&hashes->first)[local_20[local_70 + -1].second],
                       (char *)(&hashes->first)[local_20[local_70].second]), iVar1 != 0)) {
      printf("collision!\n  string 1: \'%s\'\n  string 2: \'%s\'\n",
             (&hashes->first)[local_20[local_70 + -1].second],
             (&hashes->first)[local_20[local_70].second]);
      local_6c = local_6c + 1;
    }
  }
  printf("\n\n%d collisions after %d runs\n",(ulong)local_6c,20000000);
  return commands._4_4_;
}

Assistant:

int main() {
  const int N = 20 * 1000 * 1000;

  // Leak these, else 10% of the runtime is spent destroying strings.
  char** commands = new char*[N];
  pair<uint64_t, int>* hashes = new pair<uint64_t, int>[N];

  srand((int)time(NULL));

  for (int i = 0; i < N; ++i) {
    RandomCommand(&commands[i]);
    hashes[i] = make_pair(BuildLog::LogEntry::HashCommand(commands[i]), i);
  }

  sort(hashes, hashes + N);

  int collision_count = 0;
  for (int i = 1; i < N; ++i) {
    if (hashes[i - 1].first == hashes[i].first) {
      if (strcmp(commands[hashes[i - 1].second],
                 commands[hashes[i].second]) != 0) {
        printf("collision!\n  string 1: '%s'\n  string 2: '%s'\n",
               commands[hashes[i - 1].second],
               commands[hashes[i].second]);
        collision_count++;
      }
    }
  }
  printf("\n\n%d collisions after %d runs\n", collision_count, N);
}